

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O0

void set_allintra_speed_features_framesize_independent(AV1_COMP *cpi,SPEED_FEATURES *sf,int speed)

{
  byte bVar1;
  byte bVar2;
  BLOCK_SIZE BVar3;
  int iVar4;
  int i;
  int use_hbd;
  int allow_screen_content_tools;
  AV1_COMMON *cm;
  int speed_local;
  SPEED_FEATURES *sf_local;
  AV1_COMP *cpi_local;
  
  bVar1 = (cpi->common).features.allow_screen_content_tools & 1;
  bVar2 = (cpi->oxcf).use_highbitdepth & 1;
  (sf->part_sf).less_rectangular_check_level = 1;
  (sf->part_sf).ml_prune_partition = 1;
  (sf->part_sf).prune_ext_partition_types_search_level = 1;
  (sf->part_sf).prune_part4_search = 2;
  (sf->part_sf).simple_motion_search_prune_rect = 1;
  iVar4 = 3;
  if (bVar2 != 0) {
    iVar4 = 1;
  }
  (sf->part_sf).ml_predict_breakout_level = iVar4;
  (sf->part_sf).reuse_prev_rd_results_for_part_ab = 1;
  (sf->part_sf).use_best_rd_for_pruning = 1;
  (sf->intra_sf).intra_pruning_with_hog = 1;
  (sf->intra_sf).prune_luma_palette_size_search_level = 1;
  (sf->intra_sf).dv_cost_upd_level = INTERNAL_COST_UPD_OFF;
  (sf->intra_sf).early_term_chroma_palette_size_search = 1;
  (sf->tx_sf).adaptive_txb_search_level = 1;
  (sf->tx_sf).intra_tx_size_search_init_depth_sqr = 1;
  (sf->tx_sf).model_based_prune_tx_search_level = 1;
  (sf->tx_sf).tx_type_search.use_reduced_intra_txset = 1;
  (sf->rt_sf).use_nonrd_pick_mode = 0;
  (sf->rt_sf).use_real_time_ref_set = 0;
  if (((cpi->twopass_frame).fr_content_type == '\x01') || (cpi->use_screen_content_tools != 0)) {
    (sf->mv_sf).exhaustive_searches_thresh = 0x100000;
  }
  else {
    (sf->mv_sf).exhaustive_searches_thresh = 0x2000000;
  }
  (sf->rd_sf).perform_coeff_opt = 1;
  (sf->hl_sf).superres_auto_search_type = '\x01';
  if (0 < speed) {
    iVar4 = 2;
    if (bVar1 != 0) {
      iVar4 = 0;
    }
    (sf->part_sf).intra_cnn_based_part_prune_level = iVar4;
    (sf->part_sf).simple_motion_search_early_term_none = 1;
    iVar4 = 2;
    if (bVar1 != 0) {
      iVar4 = 1;
    }
    (sf->part_sf).simple_motion_search_split = iVar4;
    iVar4 = 3;
    if (bVar2 != 0) {
      iVar4 = 2;
    }
    (sf->part_sf).ml_predict_breakout_level = iVar4;
    (sf->part_sf).reuse_best_prediction_for_part_ab = 1;
    (sf->mv_sf).exhaustive_searches_thresh = (sf->mv_sf).exhaustive_searches_thresh << 1;
    (sf->intra_sf).prune_palette_search_level = 1;
    (sf->intra_sf).prune_luma_palette_size_search_level = 2;
    (sf->intra_sf).top_intra_model_count_allowed = 3;
    (sf->tx_sf).adaptive_txb_search_level = 2;
    (sf->tx_sf).inter_tx_size_search_init_depth_rect = 1;
    (sf->tx_sf).inter_tx_size_search_init_depth_sqr = 1;
    (sf->tx_sf).intra_tx_size_search_init_depth_rect = 1;
    (sf->tx_sf).model_based_prune_tx_search_level = 0;
    (sf->tx_sf).tx_type_search.ml_tx_split_thresh = 4000;
    (sf->tx_sf).tx_type_search.prune_2d_txfm_mode = '\x02';
    (sf->tx_sf).tx_type_search.skip_tx_search = 1;
    (sf->rd_sf).perform_coeff_opt = 2;
    (sf->rd_sf).tx_domain_dist_level = 1;
    (sf->rd_sf).tx_domain_dist_thres_level = 1;
    (sf->lpf_sf).cdef_pick_method = CDEF_FAST_SEARCH_LVL1;
    (sf->lpf_sf).dual_sgr_penalty_level = 1;
    (sf->lpf_sf).enable_sgr_ep_pruning = 1;
  }
  if (1 < speed) {
    (sf->mv_sf).auto_mv_step_size = 1;
    (sf->intra_sf).disable_smooth_intra = 1;
    (sf->intra_sf).intra_pruning_with_hog = 2;
    (sf->intra_sf).prune_filter_intra_level = 1;
    (sf->rd_sf).perform_coeff_opt = 3;
    (sf->lpf_sf).prune_wiener_based_on_src_var = 1;
    (sf->lpf_sf).prune_sgr_based_on_wiener = 1;
  }
  if (2 < speed) {
    (sf->hl_sf).high_precision_mv_usage = '\x01';
    (sf->hl_sf).recode_loop = '\x01';
    (sf->part_sf).less_rectangular_check_level = 2;
    (sf->part_sf).simple_motion_search_prune_agg = 1;
    (sf->part_sf).prune_ext_part_using_split_info = 1;
    (sf->mv_sf).full_pixel_search_level = 1;
    (sf->mv_sf).search_method = '\0';
    (sf->intra_sf).chroma_intra_pruning_with_hog = 2;
    (sf->intra_sf).intra_pruning_with_hog = 3;
    (sf->intra_sf).prune_palette_search_level = 2;
    (sf->tx_sf).adaptive_txb_search_level = 2;
    (sf->tx_sf).tx_type_search.use_skip_flag_prediction = 2;
    (sf->tx_sf).use_rd_based_breakout_for_intra_tx_search = true;
    iVar4 = 2;
    if (bVar1 != 0) {
      iVar4 = 1;
    }
    (sf->lpf_sf).prune_sgr_based_on_wiener = iVar4;
    (sf->lpf_sf).disable_loop_restoration_chroma = 0;
    (sf->lpf_sf).reduce_wiener_window_size = 1;
    (sf->lpf_sf).prune_wiener_based_on_src_var = 2;
  }
  if (3 < speed) {
    (sf->mv_sf).subpel_search_method = '\x02';
    (sf->part_sf).simple_motion_search_prune_agg = 2;
    (sf->part_sf).simple_motion_search_reduce_search_steps = 4;
    (sf->part_sf).prune_ext_part_using_split_info = 2;
    (sf->part_sf).early_term_after_none_split = 1;
    (sf->part_sf).ml_predict_breakout_level = 3;
    (sf->intra_sf).prune_chroma_modes_using_luma_winner = 1;
    (sf->mv_sf).simple_motion_subpel_force_stop = '\x02';
    (sf->tpl_sf).prune_starting_mv = 2;
    (sf->tpl_sf).subpel_force_stop = '\x02';
    (sf->tpl_sf).search_method = '\t';
    (sf->tx_sf).tx_type_search.winner_mode_tx_type_pruning = 2;
    (sf->tx_sf).tx_type_search.fast_intra_tx_type_search = 1;
    (sf->tx_sf).tx_type_search.prune_2d_txfm_mode = '\x03';
    (sf->tx_sf).tx_type_search.prune_tx_type_est_rd = 1;
    (sf->rd_sf).perform_coeff_opt = 5;
    (sf->rd_sf).tx_domain_dist_thres_level = 3;
    (sf->lpf_sf).lpf_pick = '\x01';
    (sf->lpf_sf).cdef_pick_method = CDEF_FAST_SEARCH_LVL3;
    (sf->mv_sf).reduce_search_range = 1;
    (sf->winner_mode_sf).enable_winner_mode_for_coeff_opt = 1;
    (sf->winner_mode_sf).enable_winner_mode_for_use_tx_domain_dist = 1;
    (sf->winner_mode_sf).multi_winner_mode_type = '\x02';
    (sf->winner_mode_sf).enable_winner_mode_for_tx_size_srch = 1;
  }
  if (4 < speed) {
    (sf->part_sf).simple_motion_search_prune_agg = 3;
    BVar3 = BLOCK_16X16;
    if (bVar1 != 0) {
      BVar3 = BLOCK_8X8;
    }
    (sf->part_sf).ext_partition_eval_thresh = BVar3;
    iVar4 = 2;
    if (bVar1 != 0) {
      iVar4 = 1;
    }
    (sf->part_sf).intra_cnn_based_part_prune_level = iVar4;
    (sf->intra_sf).chroma_intra_pruning_with_hog = 3;
    (sf->lpf_sf).use_coarse_filter_level_search = 0;
    (sf->lpf_sf).disable_wiener_filter = true;
    (sf->lpf_sf).disable_sgr_filter = true;
    (sf->mv_sf).prune_mesh_search = PRUNE_MESH_SEARCH_LVL_2;
    (sf->winner_mode_sf).multi_winner_mode_type = '\x01';
  }
  if (5 < speed) {
    (sf->intra_sf).prune_smooth_intra_mode_for_chroma = true;
    (sf->intra_sf).prune_filter_intra_level = 2;
    (sf->intra_sf).chroma_intra_pruning_with_hog = 4;
    (sf->intra_sf).intra_pruning_with_hog = 4;
    (sf->intra_sf).cfl_search_range = 1;
    (sf->intra_sf).top_intra_model_count_allowed = 2;
    (sf->intra_sf).adapt_top_model_rd_count_using_neighbors = 1;
    (sf->intra_sf).prune_luma_odd_delta_angles_in_intra = 1;
    iVar4 = 2;
    if (bVar1 != 0) {
      iVar4 = 0;
    }
    (sf->part_sf).prune_rectangular_split_based_on_qidx = iVar4;
    (sf->part_sf).prune_rect_part_using_4x4_var_deviation = true;
    (sf->part_sf).prune_rect_part_using_none_pred_mode = true;
    (sf->part_sf).prune_sub_8x8_partition_level = (uint)(bVar1 == 0);
    (sf->part_sf).prune_part4_search = 3;
    (sf->part_sf).default_max_partition_size = BLOCK_32X32;
    (sf->mv_sf).use_bsize_dependent_search_method = 1;
    (sf->tx_sf).tx_type_search.winner_mode_tx_type_pruning = 3;
    (sf->tx_sf).tx_type_search.prune_tx_type_est_rd = 0;
    (sf->tx_sf).prune_intra_tx_depths_using_nn = true;
    (sf->rd_sf).perform_coeff_opt = 6;
    (sf->rd_sf).tx_domain_dist_level = 3;
    (sf->lpf_sf).cdef_pick_method = CDEF_FAST_SEARCH_LVL4;
    (sf->lpf_sf).lpf_pick = '\x03';
    (sf->winner_mode_sf).multi_winner_mode_type = '\0';
    (sf->winner_mode_sf).prune_winner_mode_eval_level = 1;
    (sf->winner_mode_sf).dc_blk_pred_level = 1;
  }
  if (6 < speed) {
    (sf->part_sf).default_min_partition_size = BLOCK_8X8;
    (sf->part_sf).partition_search_type = '\x02';
    (sf->lpf_sf).cdef_pick_method = CDEF_PICK_FROM_Q;
    (sf->rt_sf).mode_search_skip_flags = (sf->rt_sf).mode_search_skip_flags | 0x10;
    (sf->rt_sf).var_part_split_threshold_shift = 7;
  }
  if (7 < speed) {
    (sf->rt_sf).hybrid_intra_pickmode = 1;
    (sf->rt_sf).use_nonrd_pick_mode = 1;
    (sf->rt_sf).nonrd_check_partition_merge_mode = 1;
    (sf->rt_sf).var_part_split_threshold_shift = 8;
    for (i = 0; i < 0x10; i = i + 1) {
      if (i < 9) {
        (sf->rt_sf).intra_y_mode_bsize_mask_nrd[i] = 7;
      }
      else {
        (sf->rt_sf).intra_y_mode_bsize_mask_nrd[i] = 1;
      }
    }
  }
  if (8 < speed) {
    (sf->inter_sf).coeff_cost_upd_level = INTERNAL_COST_UPD_SBROW;
    (sf->inter_sf).mode_cost_upd_level = INTERNAL_COST_UPD_SBROW;
    (sf->rt_sf).nonrd_check_partition_merge_mode = 0;
    (sf->rt_sf).hybrid_intra_pickmode = 0;
    (sf->rt_sf).var_part_split_threshold_shift = 9;
    (sf->rt_sf).vbp_prune_16x16_split_using_min_max_sub_blk_var = true;
    (sf->rt_sf).prune_h_pred_using_best_mode_so_far = true;
    (sf->rt_sf).enable_intra_mode_pruning_using_neighbors = true;
    (sf->rt_sf).prune_intra_mode_using_best_sad_so_far = true;
  }
  if ((sf->intra_sf).prune_chroma_modes_using_luma_winner != 0) {
    (sf->intra_sf).chroma_intra_pruning_with_hog = 0;
  }
  return;
}

Assistant:

static void set_allintra_speed_features_framesize_independent(
    const AV1_COMP *const cpi, SPEED_FEATURES *const sf, int speed) {
  const AV1_COMMON *const cm = &cpi->common;
  const int allow_screen_content_tools =
      cm->features.allow_screen_content_tools;
  const int use_hbd = cpi->oxcf.use_highbitdepth;

  sf->part_sf.less_rectangular_check_level = 1;
  sf->part_sf.ml_prune_partition = 1;
  sf->part_sf.prune_ext_partition_types_search_level = 1;
  sf->part_sf.prune_part4_search = 2;
  sf->part_sf.simple_motion_search_prune_rect = 1;
  sf->part_sf.ml_predict_breakout_level = use_hbd ? 1 : 3;
  sf->part_sf.reuse_prev_rd_results_for_part_ab = 1;
  sf->part_sf.use_best_rd_for_pruning = 1;

  sf->intra_sf.intra_pruning_with_hog = 1;
  sf->intra_sf.prune_luma_palette_size_search_level = 1;
  sf->intra_sf.dv_cost_upd_level = INTERNAL_COST_UPD_OFF;
  sf->intra_sf.early_term_chroma_palette_size_search = 1;

  sf->tx_sf.adaptive_txb_search_level = 1;
  sf->tx_sf.intra_tx_size_search_init_depth_sqr = 1;
  sf->tx_sf.model_based_prune_tx_search_level = 1;
  sf->tx_sf.tx_type_search.use_reduced_intra_txset = 1;

  sf->rt_sf.use_nonrd_pick_mode = 0;
  sf->rt_sf.use_real_time_ref_set = 0;

  if (cpi->twopass_frame.fr_content_type == FC_GRAPHICS_ANIMATION ||
      cpi->use_screen_content_tools) {
    sf->mv_sf.exhaustive_searches_thresh = (1 << 20);
  } else {
    sf->mv_sf.exhaustive_searches_thresh = (1 << 25);
  }

  sf->rd_sf.perform_coeff_opt = 1;
  sf->hl_sf.superres_auto_search_type = SUPERRES_AUTO_DUAL;

  if (speed >= 1) {
    sf->part_sf.intra_cnn_based_part_prune_level =
        allow_screen_content_tools ? 0 : 2;
    sf->part_sf.simple_motion_search_early_term_none = 1;
    // TODO(Venkat): Clean-up frame type dependency for
    // simple_motion_search_split in partition search function and set the
    // speed feature accordingly
    sf->part_sf.simple_motion_search_split = allow_screen_content_tools ? 1 : 2;
    sf->part_sf.ml_predict_breakout_level = use_hbd ? 2 : 3;
    sf->part_sf.reuse_best_prediction_for_part_ab = 1;

    sf->mv_sf.exhaustive_searches_thresh <<= 1;

    sf->intra_sf.prune_palette_search_level = 1;
    sf->intra_sf.prune_luma_palette_size_search_level = 2;
    sf->intra_sf.top_intra_model_count_allowed = 3;

    sf->tx_sf.adaptive_txb_search_level = 2;
    sf->tx_sf.inter_tx_size_search_init_depth_rect = 1;
    sf->tx_sf.inter_tx_size_search_init_depth_sqr = 1;
    sf->tx_sf.intra_tx_size_search_init_depth_rect = 1;
    sf->tx_sf.model_based_prune_tx_search_level = 0;
    sf->tx_sf.tx_type_search.ml_tx_split_thresh = 4000;
    sf->tx_sf.tx_type_search.prune_2d_txfm_mode = TX_TYPE_PRUNE_2;
    sf->tx_sf.tx_type_search.skip_tx_search = 1;

    sf->rd_sf.perform_coeff_opt = 2;
    sf->rd_sf.tx_domain_dist_level = 1;
    sf->rd_sf.tx_domain_dist_thres_level = 1;

    sf->lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL1;
    sf->lpf_sf.dual_sgr_penalty_level = 1;
    sf->lpf_sf.enable_sgr_ep_pruning = 1;
  }

  if (speed >= 2) {
    sf->mv_sf.auto_mv_step_size = 1;

    sf->intra_sf.disable_smooth_intra = 1;
    sf->intra_sf.intra_pruning_with_hog = 2;
    sf->intra_sf.prune_filter_intra_level = 1;

    sf->rd_sf.perform_coeff_opt = 3;

    sf->lpf_sf.prune_wiener_based_on_src_var = 1;
    sf->lpf_sf.prune_sgr_based_on_wiener = 1;
  }

  if (speed >= 3) {
    sf->hl_sf.high_precision_mv_usage = CURRENT_Q;
    sf->hl_sf.recode_loop = ALLOW_RECODE_KFARFGF;

    sf->part_sf.less_rectangular_check_level = 2;
    sf->part_sf.simple_motion_search_prune_agg = SIMPLE_AGG_LVL1;
    sf->part_sf.prune_ext_part_using_split_info = 1;

    sf->mv_sf.full_pixel_search_level = 1;
    sf->mv_sf.search_method = DIAMOND;

    // TODO(chiyotsai@google.com): the thresholds chosen for intra hog are
    // inherited directly from luma hog with some minor tweaking. Eventually we
    // should run this with a bayesian optimizer to find the Pareto frontier.
    sf->intra_sf.chroma_intra_pruning_with_hog = 2;
    sf->intra_sf.intra_pruning_with_hog = 3;
    sf->intra_sf.prune_palette_search_level = 2;

    sf->tx_sf.adaptive_txb_search_level = 2;
    sf->tx_sf.tx_type_search.use_skip_flag_prediction = 2;
    sf->tx_sf.use_rd_based_breakout_for_intra_tx_search = true;

    // TODO(any): evaluate if these lpf features can be moved to speed 2.
    // For screen content, "prune_sgr_based_on_wiener = 2" cause large quality
    // loss.
    sf->lpf_sf.prune_sgr_based_on_wiener = allow_screen_content_tools ? 1 : 2;
    sf->lpf_sf.disable_loop_restoration_chroma = 0;
    sf->lpf_sf.reduce_wiener_window_size = 1;
    sf->lpf_sf.prune_wiener_based_on_src_var = 2;
  }

  if (speed >= 4) {
    sf->mv_sf.subpel_search_method = SUBPEL_TREE_PRUNED_MORE;

    sf->part_sf.simple_motion_search_prune_agg = SIMPLE_AGG_LVL2;
    sf->part_sf.simple_motion_search_reduce_search_steps = 4;
    sf->part_sf.prune_ext_part_using_split_info = 2;
    sf->part_sf.early_term_after_none_split = 1;
    sf->part_sf.ml_predict_breakout_level = 3;

    sf->intra_sf.prune_chroma_modes_using_luma_winner = 1;

    sf->mv_sf.simple_motion_subpel_force_stop = HALF_PEL;

    sf->tpl_sf.prune_starting_mv = 2;
    sf->tpl_sf.subpel_force_stop = HALF_PEL;
    sf->tpl_sf.search_method = FAST_BIGDIA;

    sf->tx_sf.tx_type_search.winner_mode_tx_type_pruning = 2;
    sf->tx_sf.tx_type_search.fast_intra_tx_type_search = 1;
    sf->tx_sf.tx_type_search.prune_2d_txfm_mode = TX_TYPE_PRUNE_3;
    sf->tx_sf.tx_type_search.prune_tx_type_est_rd = 1;

    sf->rd_sf.perform_coeff_opt = 5;
    sf->rd_sf.tx_domain_dist_thres_level = 3;

    sf->lpf_sf.lpf_pick = LPF_PICK_FROM_FULL_IMAGE_NON_DUAL;
    sf->lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL3;

    sf->mv_sf.reduce_search_range = 1;

    sf->winner_mode_sf.enable_winner_mode_for_coeff_opt = 1;
    sf->winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist = 1;
    sf->winner_mode_sf.multi_winner_mode_type = MULTI_WINNER_MODE_DEFAULT;
    sf->winner_mode_sf.enable_winner_mode_for_tx_size_srch = 1;
  }

  if (speed >= 5) {
    sf->part_sf.simple_motion_search_prune_agg = SIMPLE_AGG_LVL3;
    sf->part_sf.ext_partition_eval_thresh =
        allow_screen_content_tools ? BLOCK_8X8 : BLOCK_16X16;
    sf->part_sf.intra_cnn_based_part_prune_level =
        allow_screen_content_tools ? 1 : 2;

    sf->intra_sf.chroma_intra_pruning_with_hog = 3;

    sf->lpf_sf.use_coarse_filter_level_search = 0;
    // Disable Wiener and Self-guided Loop restoration filters.
    sf->lpf_sf.disable_wiener_filter = true;
    sf->lpf_sf.disable_sgr_filter = true;

    sf->mv_sf.prune_mesh_search = PRUNE_MESH_SEARCH_LVL_2;

    sf->winner_mode_sf.multi_winner_mode_type = MULTI_WINNER_MODE_FAST;
  }

  if (speed >= 6) {
    sf->intra_sf.prune_smooth_intra_mode_for_chroma = 1;
    sf->intra_sf.prune_filter_intra_level = 2;
    sf->intra_sf.chroma_intra_pruning_with_hog = 4;
    sf->intra_sf.intra_pruning_with_hog = 4;
    sf->intra_sf.cfl_search_range = 1;
    sf->intra_sf.top_intra_model_count_allowed = 2;
    sf->intra_sf.adapt_top_model_rd_count_using_neighbors = 1;
    sf->intra_sf.prune_luma_odd_delta_angles_in_intra = 1;

    sf->part_sf.prune_rectangular_split_based_on_qidx =
        allow_screen_content_tools ? 0 : 2;
    sf->part_sf.prune_rect_part_using_4x4_var_deviation = true;
    sf->part_sf.prune_rect_part_using_none_pred_mode = true;
    sf->part_sf.prune_sub_8x8_partition_level =
        allow_screen_content_tools ? 0 : 1;
    sf->part_sf.prune_part4_search = 3;
    // TODO(jingning): This might not be a good trade off if the
    // target image quality is very low.
    sf->part_sf.default_max_partition_size = BLOCK_32X32;

    sf->mv_sf.use_bsize_dependent_search_method = 1;

    sf->tx_sf.tx_type_search.winner_mode_tx_type_pruning = 3;
    sf->tx_sf.tx_type_search.prune_tx_type_est_rd = 0;
    sf->tx_sf.prune_intra_tx_depths_using_nn = true;

    sf->rd_sf.perform_coeff_opt = 6;
    sf->rd_sf.tx_domain_dist_level = 3;

    sf->lpf_sf.cdef_pick_method = CDEF_FAST_SEARCH_LVL4;
    sf->lpf_sf.lpf_pick = LPF_PICK_FROM_Q;

    sf->winner_mode_sf.multi_winner_mode_type = MULTI_WINNER_MODE_OFF;
    sf->winner_mode_sf.prune_winner_mode_eval_level = 1;
    sf->winner_mode_sf.dc_blk_pred_level = 1;
  }
  // The following should make all-intra mode speed 7 approximately equal
  // to real-time speed 6,
  // all-intra speed 8 close to real-time speed 7, and all-intra speed 9
  // close to real-time speed 8
  if (speed >= 7) {
    sf->part_sf.default_min_partition_size = BLOCK_8X8;
    sf->part_sf.partition_search_type = VAR_BASED_PARTITION;
    sf->lpf_sf.cdef_pick_method = CDEF_PICK_FROM_Q;
    sf->rt_sf.mode_search_skip_flags |= FLAG_SKIP_INTRA_DIRMISMATCH;
    sf->rt_sf.var_part_split_threshold_shift = 7;
  }

  if (speed >= 8) {
    sf->rt_sf.hybrid_intra_pickmode = 1;
    sf->rt_sf.use_nonrd_pick_mode = 1;
    sf->rt_sf.nonrd_check_partition_merge_mode = 1;
    sf->rt_sf.var_part_split_threshold_shift = 8;
    // Set mask for intra modes.
    for (int i = 0; i < BLOCK_SIZES; ++i)
      if (i >= BLOCK_32X32)
        sf->rt_sf.intra_y_mode_bsize_mask_nrd[i] = INTRA_DC;
      else
        // Use DC, H, V intra mode for block sizes < 32X32.
        sf->rt_sf.intra_y_mode_bsize_mask_nrd[i] = INTRA_DC_H_V;
  }

  if (speed >= 9) {
    sf->inter_sf.coeff_cost_upd_level = INTERNAL_COST_UPD_SBROW;
    sf->inter_sf.mode_cost_upd_level = INTERNAL_COST_UPD_SBROW;

    sf->rt_sf.nonrd_check_partition_merge_mode = 0;
    sf->rt_sf.hybrid_intra_pickmode = 0;
    sf->rt_sf.var_part_split_threshold_shift = 9;
    sf->rt_sf.vbp_prune_16x16_split_using_min_max_sub_blk_var = true;
    sf->rt_sf.prune_h_pred_using_best_mode_so_far = true;
    sf->rt_sf.enable_intra_mode_pruning_using_neighbors = true;
    sf->rt_sf.prune_intra_mode_using_best_sad_so_far = true;
  }

  // As the speed feature prune_chroma_modes_using_luma_winner already
  // constrains the number of chroma directional mode evaluations to a maximum
  // of 1, the HOG computation and the associated pruning logic does not seem to
  // help speed-up the chroma mode evaluations. Hence disable the speed feature
  // chroma_intra_pruning_with_hog when prune_chroma_modes_using_luma_winner is
  // enabled.
  if (sf->intra_sf.prune_chroma_modes_using_luma_winner)
    sf->intra_sf.chroma_intra_pruning_with_hog = 0;
}